

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsbDec6.c
# Opt level: O3

void Rsb_DecPrintTable(word *pCexes,int nGs,int nGsAll,Vec_Int_t *vTries)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  long lVar8;
  int pCands [16];
  ulong local_98;
  int local_78 [18];
  
  if (vTries->nSize == 0) {
    return;
  }
  iVar5 = 4;
  do {
    printf("    ");
    iVar5 = iVar5 + -1;
  } while (iVar5 != 0);
  printf("  ");
  uVar6 = 0;
  if (0 < nGs) {
    uVar2 = 0;
    iVar5 = nGs;
    do {
      printf("%d",(ulong)((byte)((char)uVar2 + (char)(uVar2 / 100) * -100) / 10));
      uVar2 = (ulong)((int)uVar2 + 1);
      iVar5 = iVar5 + -1;
      uVar6 = nGs;
    } while (iVar5 != 0);
  }
  putchar(0x7c);
  iVar5 = nGsAll - uVar6;
  if (iVar5 != 0 && (int)uVar6 <= nGsAll) {
    do {
      printf("%d",(ulong)((byte)((char)uVar6 + (char)(uVar6 / 100) * -100) / 10));
      uVar6 = uVar6 + 1;
      iVar5 = iVar5 + -1;
    } while (iVar5 != 0);
  }
  putchar(10);
  iVar5 = 4;
  do {
    printf("    ");
    iVar5 = iVar5 + -1;
  } while (iVar5 != 0);
  printf("  ");
  uVar6 = 0;
  if (0 < nGs) {
    uVar2 = 0;
    iVar5 = nGs;
    do {
      printf("%d",(ulong)(uint)((int)uVar2 + (int)(uVar2 / 10) * -10));
      uVar2 = (ulong)((int)uVar2 + 1);
      iVar5 = iVar5 + -1;
      uVar6 = nGs;
    } while (iVar5 != 0);
  }
  putchar(0x7c);
  iVar5 = nGsAll - uVar6;
  if (iVar5 != 0 && (int)uVar6 <= nGsAll) {
    do {
      printf("%d",(ulong)(uVar6 % 10));
      uVar6 = uVar6 + 1;
      iVar5 = iVar5 + -1;
    } while (iVar5 != 0);
  }
  putchar(10);
  putchar(10);
  iVar5 = vTries->nSize;
  uVar7 = (ulong)(uint)nGs;
  uVar2 = (ulong)(uint)nGsAll;
  if (0 < iVar5) {
    local_98 = 0;
    uVar6 = 0;
    do {
      local_78[0] = -1;
      local_78[1] = 0xffffffff;
      local_78[2] = 0xffffffff;
      local_78[3] = 0xffffffff;
      uVar1 = iVar5 - uVar6;
      if (uVar1 != 0 && (int)uVar6 <= iVar5) {
        uVar3 = (ulong)uVar6;
        uVar4 = 0;
        do {
          if ((int)uVar6 < 0) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                          ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          if (vTries->pArray[uVar3] == -1) {
            uVar6 = (int)uVar3 + 1;
            uVar1 = (uint)uVar4;
            break;
          }
          local_78[uVar4] = vTries->pArray[uVar3];
          uVar4 = uVar4 + 1;
          uVar3 = uVar3 + 1;
        } while (uVar1 != uVar4);
        if (4 < uVar1) {
          __assert_fail("nCands <= 4",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/rsb/rsbDec6.c"
                        ,0xef,"void Rsb_DecPrintTable(word *, int, int, Vec_Int_t *)");
        }
      }
      lVar8 = 0;
      do {
        if (local_78[lVar8] < 0) {
          printf("    ");
        }
        else {
          printf("%4d");
        }
        lVar8 = lVar8 + 1;
      } while (lVar8 != 4);
      uVar3 = 0;
      printf("  ");
      if (0 < nGs) {
        uVar3 = 0;
        do {
          putchar((uint)((pCexes[(local_98 >> 6) + uVar3] & 1L << ((byte)local_98 & 0x3f)) != 0) * 3
                  + 0x2b);
          uVar3 = uVar3 + 1;
        } while (uVar7 != uVar3);
        uVar3 = (ulong)(uint)nGs;
      }
      putchar(0x7c);
      if ((int)uVar3 < nGsAll) {
        do {
          putchar((uint)((pCexes[(local_98 >> 6) + uVar3] & 1L << ((byte)local_98 & 0x3f)) != 0) * 3
                  + 0x2b);
          uVar3 = uVar3 + 1;
        } while (uVar2 != uVar3);
      }
      printf("  %3d\n",local_98 & 0xffffffff);
      local_98 = local_98 + 1;
      iVar5 = vTries->nSize;
    } while ((int)uVar6 < iVar5);
  }
  putchar(10);
  iVar5 = 4;
  do {
    printf("    ");
    iVar5 = iVar5 + -1;
  } while (iVar5 != 0);
  uVar3 = 0;
  printf("  ");
  if (0 < nGs) {
    uVar3 = 0;
    do {
      uVar4 = pCexes[uVar3] - (pCexes[uVar3] >> 1 & 0x5555555555555555);
      uVar4 = (uVar4 >> 2 & 0x3333333333333333) + (uVar4 & 0x3333333333333333);
      uVar4 = (uVar4 >> 4) + uVar4 & 0xf0f0f0f0f0f0f0f;
      uVar4 = (uVar4 >> 8) + uVar4;
      lVar8 = (uVar4 >> 0x10) + uVar4;
      printf("%d",(ulong)(((int)((ulong)lVar8 >> 0x20) + (int)lVar8 & 0xffU) / 10));
      uVar3 = uVar3 + 1;
    } while (uVar7 != uVar3);
    uVar3 = (ulong)(uint)nGs;
  }
  putchar(0x7c);
  if ((int)uVar3 < nGsAll) {
    do {
      uVar4 = pCexes[uVar3] - (pCexes[uVar3] >> 1 & 0x5555555555555555);
      uVar4 = (uVar4 >> 2 & 0x3333333333333333) + (uVar4 & 0x3333333333333333);
      uVar4 = (uVar4 >> 4) + uVar4 & 0xf0f0f0f0f0f0f0f;
      uVar4 = (uVar4 >> 8) + uVar4;
      lVar8 = (uVar4 >> 0x10) + uVar4;
      printf("%d",(ulong)(((int)((ulong)lVar8 >> 0x20) + (int)lVar8 & 0xffU) / 10));
      uVar3 = uVar3 + 1;
    } while (uVar2 != uVar3);
  }
  putchar(10);
  iVar5 = 4;
  do {
    printf("    ");
    iVar5 = iVar5 + -1;
  } while (iVar5 != 0);
  printf("  ");
  uVar6 = 0;
  if (0 < nGs) {
    uVar3 = 0;
    do {
      uVar4 = pCexes[uVar3] - (pCexes[uVar3] >> 1 & 0x5555555555555555);
      uVar4 = (uVar4 >> 2 & 0x3333333333333333) + (uVar4 & 0x3333333333333333);
      uVar4 = (uVar4 >> 4) + uVar4 & 0xf0f0f0f0f0f0f0f;
      uVar4 = (uVar4 >> 8) + uVar4;
      lVar8 = (uVar4 >> 0x10) + uVar4;
      uVar6 = (int)((ulong)lVar8 >> 0x20) + (int)lVar8;
      printf("%d",(ulong)(byte)((char)uVar6 + ((byte)((uVar6 & 0xff) / 5) & 0xfe) * -5));
      uVar3 = uVar3 + 1;
      uVar6 = nGs;
    } while (uVar7 != uVar3);
  }
  putchar(0x7c);
  if ((int)uVar6 < nGsAll) {
    uVar7 = (ulong)uVar6;
    do {
      uVar3 = pCexes[uVar7] - (pCexes[uVar7] >> 1 & 0x5555555555555555);
      uVar3 = (uVar3 >> 2 & 0x3333333333333333) + (uVar3 & 0x3333333333333333);
      uVar3 = (uVar3 >> 4) + uVar3 & 0xf0f0f0f0f0f0f0f;
      uVar3 = (uVar3 >> 8) + uVar3;
      lVar8 = (uVar3 >> 0x10) + uVar3;
      uVar6 = (int)((ulong)lVar8 >> 0x20) + (int)lVar8;
      printf("%d",(ulong)(byte)((char)uVar6 + ((byte)((uVar6 & 0xff) / 5) & 0xfe) * -5));
      uVar7 = uVar7 + 1;
    } while (uVar2 != uVar7);
  }
  putchar(10);
  putchar(10);
  return;
}

Assistant:

void Rsb_DecPrintTable( word * pCexes, int nGs, int nGsAll, Vec_Int_t * vTries ) 
{
    int pCands[16], nCands;
    int i, c, Cand, iStart = 0;
    if ( Vec_IntSize(vTries) == 0 )
        return;

//    printf( "\n" );
    for ( i = 0; i < 4; i++ )
        printf( "    " );
    printf( "  " );
    for ( i = 0; i < nGs; i++ )
        printf( "%d", (i % 100) / 10 );
    printf( "|" );
    for ( ; i < nGsAll; i++ )
        printf( "%d", (i % 100) / 10 );
    printf( "\n" );

    for ( i = 0; i < 4; i++ )
        printf( "    " );
    printf( "  " );
    for ( i = 0; i < nGs; i++ )
        printf( "%d", i % 10 );
    printf( "|" );
    for ( ; i < nGsAll; i++ )
        printf( "%d", i % 10 );
    printf( "\n" );
    printf( "\n" );

    for ( c = 0; iStart < Vec_IntSize(vTries); c++ )
    {
        // collect candidates
        for ( i = 0; i < 4; i++ )
            pCands[i] = -1;
        nCands = 0;
        Vec_IntForEachEntryStart( vTries, Cand, i, iStart )
            if ( Cand == -1 )
            {
                iStart = i + 1;
                break;
            }
            else
                pCands[nCands++] = Cand;
        assert( nCands <= 4 );
        // print them
        for ( i = 0; i < 4; i++ )
            if ( pCands[i] >= 0 )
                printf( "%4d", pCands[i] );
            else
                printf( "    " );
        // print the bit-string
        printf( "  " );
        for ( i = 0; i < nGs; i++ )
            printf( "%c", Abc_TtGetBit( pCexes + i, c ) ? '.' : '+' );
        printf( "|" );
        for ( ; i < nGsAll; i++ )
            printf( "%c", Abc_TtGetBit( pCexes + i, c ) ? '.' : '+' );
        printf( "  %3d\n", c );
    }
    printf( "\n" );

    // write the number of ones
    for ( i = 0; i < 4; i++ )
        printf( "    " );
    printf( "  " );
    for ( i = 0; i < nGs; i++ )
        printf( "%d", Abc_TtCountOnes(pCexes[i]) / 10 );
    printf( "|" );
    for ( ; i < nGsAll; i++ )
        printf( "%d", Abc_TtCountOnes(pCexes[i]) / 10 );
    printf( "\n" );

    for ( i = 0; i < 4; i++ )
        printf( "    " );
    printf( "  " );
    for ( i = 0; i < nGs; i++ )
        printf( "%d", Abc_TtCountOnes(pCexes[i]) % 10 );
    printf( "|" );
    for ( ; i < nGsAll; i++ )
        printf( "%d", Abc_TtCountOnes(pCexes[i]) % 10 );
    printf( "\n" );
    printf( "\n" );
}